

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_is_bgzf(char *fn)

{
  int iVar1;
  hFILE *fp;
  ssize_t sVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  uint8_t buf [16];
  
  fp = hopen(fn,"r");
  uVar3 = 0;
  if (fp != (hFILE *)0x0) {
    sVar2 = hread(fp,buf,0x10);
    iVar1 = hclose(fp);
    if (iVar1 < 0) {
      uVar3 = 0xffffffff;
    }
    else if ((int)sVar2 == 0x10) {
      auVar4[0] = -(buf[0] == '\x1f');
      auVar4[1] = -(buf[1] == 0x8b);
      auVar4[2] = -(buf[2] == '\b');
      auVar4[3] = -(buf[3] == '\x04');
      auVar4[4] = -(buf[4] == '\0');
      auVar4[5] = -(buf[5] == '\0');
      auVar4[6] = -(buf[6] == '\0');
      auVar4[7] = -(buf[7] == '\0');
      auVar4[8] = -(buf[8] == '\0');
      auVar4[9] = -(buf[9] == 0xff);
      auVar4[10] = -(buf[10] == '\x06');
      auVar4[0xb] = -(buf[0xb] == '\0');
      auVar4[0xc] = -(buf[0xc] == 'B');
      auVar4[0xd] = -(buf[0xd] == 'C');
      auVar4[0xe] = -(buf[0xe] == '\x02');
      auVar4[0xf] = -(buf[0xf] == '\0');
      uVar3 = (uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                             (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
    }
  }
  return uVar3;
}

Assistant:

int bgzf_is_bgzf(const char *fn)
{
    uint8_t buf[16];
    int n;
    hFILE *fp;
    if ((fp = hopen(fn, "r")) == 0) return 0;
    n = hread(fp, buf, 16);
    if ( hclose(fp) < 0 ) return -1;
    if (n != 16) return 0;
    return memcmp(g_magic, buf, 16) == 0? 1 : 0;
}